

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::shouldResolveCycle
          (CAPIBuildSystemFrontendDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items,
          Rule *candidateRule,CycleAction action)

{
  _func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
  *p_Var1;
  void *pvVar2;
  uint8_t uVar3;
  llb_cycle_action_t lVar4;
  CAPIBuildKey *this_00;
  llb_build_key_t **pplVar5;
  uint64_t uVar6;
  uint8_t result;
  llb_build_key_t *candidate;
  BuildKey key;
  CAPIRulesVector rules;
  CycleAction action_local;
  Rule *candidateRule_local;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  
  if ((this->cAPIDelegate).should_resolve_cycle ==
      (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
       *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    CAPIRulesVector::CAPIRulesVector((CAPIRulesVector *)((long)&key.key.key.field_2 + 8),items);
    llbuild::buildsystem::BuildKey::fromData((BuildKey *)&candidate,&candidateRule->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,(BuildKey *)&candidate);
    p_Var1 = (this->cAPIDelegate).should_resolve_cycle;
    pvVar2 = (this->cAPIDelegate).context;
    pplVar5 = CAPIRulesVector::data((CAPIRulesVector *)((long)&key.key.key.field_2 + 8));
    uVar6 = CAPIRulesVector::count((CAPIRulesVector *)((long)&key.key.key.field_2 + 8));
    lVar4 = convertCycleAction(action);
    uVar3 = (*p_Var1)(pvVar2,pplVar5,uVar6,(llb_build_key_t *)this_00,lVar4);
    llb_build_key_destroy((llb_build_key_t *)this_00);
    this_local._7_1_ = uVar3 != '\0';
    llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&candidate);
    CAPIRulesVector::~CAPIRulesVector((CAPIRulesVector *)((long)&key.key.key.field_2 + 8));
  }
  return this_local._7_1_;
}

Assistant:

virtual bool shouldResolveCycle(const std::vector<core::Rule*>& items,
                                  core::Rule* candidateRule,
                                  core::Rule::CycleAction action) override {
    if (!cAPIDelegate.should_resolve_cycle)
      return false;

    CAPIRulesVector rules(items);
    auto key = BuildKey::fromData(candidateRule->key);
    auto candidate = (llb_build_key_t *)new CAPIBuildKey(key);

    uint8_t result = cAPIDelegate.should_resolve_cycle(cAPIDelegate.context,
                                                       rules.data(),
                                                       rules.count(),
                                                       candidate,
                                                       convertCycleAction(action));

    llb_build_key_destroy(candidate);

    return (result);
  }